

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void * __thiscall
google::protobuf::internal::SerialArena::AllocateAlignedWithCleanupFallback
          (SerialArena *this,size_t n,size_t align,_func_void_void_ptr *destructor)

{
  __pointer_type pAVar1;
  ArenaBlock *this_00;
  __pointer_type pcVar2;
  CleanupNode *pCVar3;
  char *pcVar4;
  ArenaBlock *this_01;
  char *pcVar5;
  ArenaAlign AVar6;
  CleanupNode *pCVar7;
  CleanupNode *pCVar8;
  int line;
  __pointer_type pAVar9;
  size_t last_size;
  __pointer_type v1;
  size_t min_bytes;
  void *elem;
  SizedPtr SVar10;
  LogMessageFatal LStack_48;
  ulong local_38;
  
  do {
    if (align < 9) {
      min_bytes = n + 7 & 0xfffffffffffffff8;
    }
    else {
      AVar6 = ArenaAlignAs(align);
      if ((AVar6.align & 7) != 0) {
        __assert_fail("false && \"ArenaAlignDefault::IsAligned(align)\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align.h"
                      ,0x84,
                      "auto google::protobuf::internal::ArenaAlign::Padded(size_t)::(anonymous class)::operator()() const"
                     );
      }
      min_bytes = (AVar6.align + n) - 8;
    }
    this_00 = (this->head_)._M_b._M_p;
    if (this_00->size == 0) {
      last_size = 0;
    }
    else {
      pcVar2 = (this->ptr_)._M_b._M_p;
      local_38 = align;
      pcVar4 = ArenaBlock::Pointer(this_00,0x10);
      (this->space_used_).super___atomic_base<unsigned_long>._M_i =
           (__int_type_conflict)
           (pcVar2 + ((this->space_used_).super___atomic_base<unsigned_long>._M_i - (long)pcVar4));
      last_size = this_00->size;
      align = local_38;
    }
    SVar10 = anon_unknown_12::AllocateBlock
                       ((AllocationPolicy *)
                        ((this->parent_->alloc_policy_).policy_ & 0xfffffffffffffff8),last_size,
                        min_bytes);
    this_01 = (ArenaBlock *)SVar10.p;
    (this->space_allocated_).super___atomic_base<unsigned_long>._M_i =
         (this->space_allocated_).super___atomic_base<unsigned_long>._M_i + SVar10.n;
    ArenaBlock::ArenaBlock(this_01,this_00,SVar10.n);
    pcVar4 = ArenaBlock::Pointer(this_01,0x10);
    pcVar5 = ArenaBlock::Pointer(this_01,this_01->size & 0xfffffffffffffff8);
    (this->ptr_)._M_b._M_p = pcVar4;
    this->prefetch_ptr_ = pcVar4;
    this->limit_ = pcVar5;
    (this->head_)._M_b._M_p = this_01;
    AVar6 = ArenaAlignAs(align);
    pcVar2 = (this->ptr_)._M_b._M_p;
    if (((ulong)pcVar2 & 7) != 0) {
      __assert_fail("false && \"ArenaAlignDefault::IsAligned(ptr)\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align.h"
                    ,0x90,
                    "auto google::protobuf::internal::ArenaAlign::CeilDefaultAligned(char *)::(anonymous class)::operator()() const"
                   );
    }
    n = n + 7 & 0xfffffffffffffff8;
    elem = (void *)(-AVar6.align & (ulong)(pcVar2 + (AVar6.align - 1)));
    pAVar1 = (__pointer_type)((long)elem + n);
  } while ((__pointer_type)this->limit_ < pAVar1);
  (this->ptr_)._M_b._M_p = (__pointer_type)pAVar1;
  pCVar7 = (this->cleanup_list_).next_;
  if (pCVar7 < (this->cleanup_list_).limit_) {
    (this->cleanup_list_).next_ = pCVar7 + 1;
    pCVar7->elem = elem;
    pCVar7->destructor = destructor;
  }
  else {
    cleanup::ChunkList::AddFallback(&this->cleanup_list_,elem,destructor,this);
  }
  pCVar7 = (CleanupNode *)(this->cleanup_list_).prefetch_ptr_;
  if ((pCVar7 != (CleanupNode *)0x0) && (pCVar7 < (CleanupNode *)(this->cleanup_list_).head_)) {
    pcVar4 = 
    "static_cast<const void*>(cleanup_list_.prefetch_ptr_) == nullptr || static_cast<const void*>(cleanup_list_.prefetch_ptr_) >= cleanup_list_.head_"
    ;
    line = 0x136;
    goto LAB_001467f9;
  }
  pCVar3 = (this->cleanup_list_).next_;
  if (((long)pCVar7 - (long)pCVar3 < 0x181) &&
     (pCVar8 = (this->cleanup_list_).limit_, pCVar7 < pCVar8)) {
    if (pCVar3 < pCVar7) {
      pCVar3 = pCVar7;
    }
    pCVar7 = pCVar3;
    if (pCVar7 != (CleanupNode *)0x0) {
      if (pCVar7 + 0x18 < pCVar8) {
        pCVar8 = pCVar7 + 0x18;
      }
      for (; pCVar7 < pCVar8; pCVar7 = pCVar7 + 4) {
      }
      goto LAB_001466a0;
    }
  }
  else {
LAB_001466a0:
    (this->cleanup_list_).prefetch_ptr_ = (char *)pCVar7;
    pAVar9 = (__pointer_type)(this->ptr_)._M_b._M_p;
    v1 = (__pointer_type)this->limit_;
    if (v1 < pAVar9) {
      pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<char_const*,char_const*>
                         ((char *)v1,(char *)pAVar9,"limit_ >= ptr()");
      line = 0xf2;
      goto LAB_001467f9;
    }
    pAVar9 = (__pointer_type)this->prefetch_ptr_;
    if ((pAVar9 != (__pointer_type)0x0) && (pAVar9 < (this->head_)._M_b._M_p)) {
      pcVar4 = 
      "static_cast<const void*>(prefetch_ptr_) == nullptr || static_cast<const void*>(prefetch_ptr_) >= head()"
      ;
      line = 0x12d;
      goto LAB_001467f9;
    }
    if ((0x400 < (long)pAVar9 - (long)pAVar1) || (v1 <= pAVar9)) {
LAB_001466e0:
      this->prefetch_ptr_ = (char *)pAVar9;
      return elem;
    }
    if (pAVar1 < pAVar9) {
      pAVar1 = pAVar9;
    }
    pAVar9 = pAVar1;
    if (pAVar9 != (__pointer_type)0x0) {
      if (pAVar9 + 0x40 < v1) {
        v1 = pAVar9 + 0x40;
      }
      for (; pAVar9 < v1; pAVar9 = pAVar9 + 4) {
      }
      goto LAB_001466e0;
    }
  }
  pcVar4 = "prefetch_ptr != nullptr";
  line = 0x122;
LAB_001467f9:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_48,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/serial_arena.h"
             ,line,pcVar4);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_48);
}

Assistant:

PROTOBUF_NOINLINE
void* SerialArena::AllocateAlignedWithCleanupFallback(
    size_t n, size_t align, void (*destructor)(void*)) {
  size_t required = AlignUpTo(n, align);
  AllocateNewBlock(required);
  return AllocateAlignedWithCleanup(n, align, destructor);
}